

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O3

bool tinyusdz::tydra::(anonymous_namespace)::TriangulatePolygon<std::array<float,3ul>,float>
               (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *points,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexCounts,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *triangulatedFaceVertexCounts,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *triangulatedFaceVertexIndices,
               vector<unsigned_long,_std::allocator<unsigned_long>_>
               *triangulatedToOrigFaceVertexIndexMap,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *triangulatedFaceCounts,
               string *err)

{
  pointer pcVar1;
  uint *__args;
  uint uVar2;
  pointer puVar3;
  pointer paVar4;
  undefined1 auVar5 [16];
  void *pvVar6;
  bool bVar7;
  undefined1 auVar8 [4];
  undefined1 auVar9 [4];
  uint *puVar10;
  pointer puVar11;
  unsigned_long *puVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  unsigned_long uVar16;
  iterator iVar17;
  iterator iVar18;
  ulong uVar19;
  ulong uVar20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *args_1;
  ulong uVar21;
  float fVar22;
  double dVar23;
  float fVar25;
  undefined1 auVar24 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar26 [16];
  undefined1 auVar27 [12];
  float fVar28;
  float fVar29;
  float3 fVar30;
  uint32_t npolys;
  vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
  polygon_2d;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  double3 n;
  array<float,_3UL> a;
  array<float,_3UL> axis_w;
  undefined1 local_148 [4];
  float fStack_144;
  undefined8 uStack_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  unsigned_long local_128;
  uint local_11c;
  string local_118;
  undefined1 local_f8 [24];
  float3 local_e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d0;
  double3 local_b8;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *local_a0;
  undefined1 local_98 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_80;
  float3 local_78;
  float3 local_68;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  
  puVar11 = (triangulatedFaceVertexCounts->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((triangulatedFaceVertexCounts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
      )._M_impl.super__Vector_impl_data._M_finish != puVar11) {
    (triangulatedFaceVertexCounts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_finish = puVar11;
  }
  puVar11 = (triangulatedFaceVertexIndices->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((triangulatedFaceVertexIndices->
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar11) {
    (triangulatedFaceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
    ._M_impl.super__Vector_impl_data._M_finish = puVar11;
  }
  puVar3 = (triangulatedToOrigFaceVertexIndexMap->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((triangulatedToOrigFaceVertexIndexMap->
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (triangulatedToOrigFaceVertexIndexMap->
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  local_f8._0_8_ = (pointer)0x0;
  puVar11 = (faceVertexCounts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((faceVertexCounts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar11) {
    uVar16 = 0;
    args_1 = triangulatedFaceVertexIndices;
    local_a0 = points;
    do {
      fVar22 = fStack_144;
      auVar8 = local_148;
      local_11c = puVar11[local_f8._0_8_];
      uVar13 = (ulong)local_11c;
      if (uVar13 < 3) {
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,
                   "faceVertex count must be 3(triangle) or more(polygon), but got faceVertexCounts[{}] = {}\n"
                   ,"");
        fmt::format<unsigned_long,unsigned_int>
                  ((string *)local_148,(fmt *)&local_118,(string *)local_f8,
                   (unsigned_long *)&local_11c,(uint *)args_1);
LAB_0033fa51:
        ::std::__cxx11::string::operator=((string *)err,(string *)local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(fStack_144,local_148) != &local_138) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(fStack_144,local_148),
                          (ulong)(local_138._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        return false;
      }
      puVar11 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(faceVertexIndices->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar11 >> 2) < uVar13 + uVar16) {
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,
                   "Invalid faceVertexIndices or faceVertexCounts. faceVertex index exceeds faceVertexIndices.size() at [{}]\n"
                   ,"");
        fmt::format<unsigned_long>((string *)local_148,&local_118,(unsigned_long *)local_f8);
        goto LAB_0033fa51;
      }
      local_148 = SUB84(uVar16,0);
      auVar9 = local_148;
      fStack_144 = (float)(uVar16 >> 0x20);
      fVar25 = fStack_144;
      fStack_144 = fVar22;
      if (uVar13 == 4) {
        local_148 = (undefined1  [4])0x3;
        iVar17._M_current =
             (triangulatedFaceVertexCounts->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        puVar10 = (triangulatedFaceVertexCounts->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        if (iVar17._M_current == puVar10) {
          ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
          _M_realloc_insert<unsigned_int>(triangulatedFaceVertexCounts,iVar17,(uint *)local_148);
          iVar17._M_current =
               (triangulatedFaceVertexCounts->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          puVar10 = (triangulatedFaceVertexCounts->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar17._M_current = 3;
          iVar17._M_current = iVar17._M_current + 1;
          (triangulatedFaceVertexCounts->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar17._M_current;
        }
        local_148 = (undefined1  [4])0x3;
        if (iVar17._M_current == puVar10) {
          ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
          _M_realloc_insert<unsigned_int>(triangulatedFaceVertexCounts,iVar17,(uint *)local_148);
        }
        else {
          *iVar17._M_current = 3;
          (triangulatedFaceVertexCounts->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar17._M_current + 1;
        }
        puVar11 = (faceVertexIndices->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        iVar17._M_current =
             (triangulatedFaceVertexIndices->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        puVar10 = (triangulatedFaceVertexIndices->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        if (iVar17._M_current == puVar10) {
          ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     triangulatedFaceVertexIndices,iVar17,puVar11 + uVar16);
          puVar11 = (faceVertexIndices->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          iVar17._M_current =
               (triangulatedFaceVertexIndices->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          puVar10 = (triangulatedFaceVertexIndices->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar17._M_current = puVar11[uVar16];
          iVar17._M_current = iVar17._M_current + 1;
          (triangulatedFaceVertexIndices->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar17._M_current;
        }
        if (iVar17._M_current == puVar10) {
          ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     triangulatedFaceVertexIndices,iVar17,puVar11 + uVar16 + 1);
          puVar11 = (faceVertexIndices->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          iVar17._M_current =
               (triangulatedFaceVertexIndices->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          puVar10 = (triangulatedFaceVertexIndices->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar17._M_current = puVar11[uVar16 + 1];
          iVar17._M_current = iVar17._M_current + 1;
          (triangulatedFaceVertexIndices->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar17._M_current;
        }
        if (iVar17._M_current == puVar10) {
          ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     triangulatedFaceVertexIndices,iVar17,puVar11 + uVar16 + 2);
          puVar11 = (faceVertexIndices->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          iVar17._M_current =
               (triangulatedFaceVertexIndices->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          puVar10 = (triangulatedFaceVertexIndices->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar17._M_current = puVar11[uVar16 + 2];
          iVar17._M_current = iVar17._M_current + 1;
          (triangulatedFaceVertexIndices->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar17._M_current;
        }
        if (iVar17._M_current == puVar10) {
          ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     triangulatedFaceVertexIndices,iVar17,puVar11 + uVar16);
          puVar11 = (faceVertexIndices->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          iVar17._M_current =
               (triangulatedFaceVertexIndices->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          puVar10 = (triangulatedFaceVertexIndices->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar17._M_current = puVar11[uVar16];
          iVar17._M_current = iVar17._M_current + 1;
          (triangulatedFaceVertexIndices->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar17._M_current;
        }
        pcVar1 = (pointer)(uVar16 + 2);
        if (iVar17._M_current == puVar10) {
          ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     triangulatedFaceVertexIndices,iVar17,puVar11 + (long)pcVar1);
          puVar11 = (faceVertexIndices->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          iVar17._M_current =
               (triangulatedFaceVertexIndices->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          puVar10 = (triangulatedFaceVertexIndices->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar17._M_current = puVar11[(long)pcVar1];
          iVar17._M_current = iVar17._M_current + 1;
          (triangulatedFaceVertexIndices->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar17._M_current;
        }
        if (iVar17._M_current == puVar10) {
          ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     triangulatedFaceVertexIndices,iVar17,puVar11 + uVar16 + 3);
        }
        else {
          *iVar17._M_current = puVar11[uVar16 + 3];
          (triangulatedFaceVertexIndices->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar17._M_current + 1;
        }
        iVar18._M_current =
             (triangulatedToOrigFaceVertexIndexMap->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        puVar12 = (triangulatedToOrigFaceVertexIndexMap->
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        if (iVar18._M_current == puVar12) {
          local_148 = auVar9;
          fStack_144 = fVar25;
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (triangulatedToOrigFaceVertexIndexMap,iVar18,(unsigned_long *)local_148);
          iVar18._M_current =
               (triangulatedToOrigFaceVertexIndexMap->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          puVar12 = (triangulatedToOrigFaceVertexIndexMap->
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar18._M_current = uVar16;
          iVar18._M_current = iVar18._M_current + 1;
          (triangulatedToOrigFaceVertexIndexMap->
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar18._M_current;
        }
        _local_148 = (pointer)(uVar16 + 1);
        if (iVar18._M_current == puVar12) {
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (triangulatedToOrigFaceVertexIndexMap,iVar18,(unsigned_long *)local_148);
          iVar18._M_current =
               (triangulatedToOrigFaceVertexIndexMap->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          puVar12 = (triangulatedToOrigFaceVertexIndexMap->
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar18._M_current = (unsigned_long)_local_148;
          iVar18._M_current = iVar18._M_current + 1;
          (triangulatedToOrigFaceVertexIndexMap->
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar18._M_current;
        }
        if (iVar18._M_current == puVar12) {
          _local_148 = pcVar1;
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (triangulatedToOrigFaceVertexIndexMap,iVar18,(unsigned_long *)local_148);
          iVar18._M_current =
               (triangulatedToOrigFaceVertexIndexMap->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          puVar12 = (triangulatedToOrigFaceVertexIndexMap->
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar18._M_current = (unsigned_long)pcVar1;
          iVar18._M_current = iVar18._M_current + 1;
          (triangulatedToOrigFaceVertexIndexMap->
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar18._M_current;
        }
        if (iVar18._M_current == puVar12) {
          local_148 = auVar9;
          fStack_144 = fVar25;
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (triangulatedToOrigFaceVertexIndexMap,iVar18,(unsigned_long *)local_148);
          iVar18._M_current =
               (triangulatedToOrigFaceVertexIndexMap->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          puVar12 = (triangulatedToOrigFaceVertexIndexMap->
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar18._M_current = uVar16;
          iVar18._M_current = iVar18._M_current + 1;
          (triangulatedToOrigFaceVertexIndexMap->
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar18._M_current;
        }
        if (iVar18._M_current == puVar12) {
          _local_148 = pcVar1;
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (triangulatedToOrigFaceVertexIndexMap,iVar18,(unsigned_long *)local_148);
          iVar18._M_current =
               (triangulatedToOrigFaceVertexIndexMap->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          puVar12 = (triangulatedToOrigFaceVertexIndexMap->
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar18._M_current = (unsigned_long)pcVar1;
          iVar18._M_current = iVar18._M_current + 1;
          (triangulatedToOrigFaceVertexIndexMap->
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar18._M_current;
        }
        pcVar1 = (pointer)(uVar16 + 3);
        fStack_144 = (float)((ulong)pcVar1 >> 0x20);
        if (iVar18._M_current == puVar12) {
          _local_148 = pcVar1;
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (triangulatedToOrigFaceVertexIndexMap,iVar18,(unsigned_long *)local_148);
        }
        else {
          *iVar18._M_current = (unsigned_long)pcVar1;
          (triangulatedToOrigFaceVertexIndexMap->
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar18._M_current + 1;
        }
        local_148 = (undefined1  [4])0x2;
        iVar17._M_current =
             (triangulatedFaceCounts->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar17._M_current ==
            (triangulatedFaceCounts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_0033f755:
          ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
          _M_realloc_insert<unsigned_int>(triangulatedFaceCounts,iVar17,(uint *)local_148);
        }
        else {
          *iVar17._M_current = 2;
LAB_0033f748:
          (triangulatedFaceCounts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_finish = iVar17._M_current + 1;
        }
      }
      else {
        if (local_11c == 3) {
          local_148 = (undefined1  [4])0x3;
          iVar17._M_current =
               (triangulatedFaceVertexCounts->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar17._M_current ==
              (triangulatedFaceVertexCounts->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(triangulatedFaceVertexCounts,iVar17,(uint *)local_148);
            puVar11 = (faceVertexIndices->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
          }
          else {
            *iVar17._M_current = 3;
            (triangulatedFaceVertexCounts->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar17._M_current + 1;
          }
          iVar17._M_current =
               (triangulatedFaceVertexIndices->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          puVar10 = (triangulatedFaceVertexIndices->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
          if (iVar17._M_current == puVar10) {
            ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                       triangulatedFaceVertexIndices,iVar17,puVar11 + uVar16);
            puVar11 = (faceVertexIndices->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            iVar17._M_current =
                 (triangulatedFaceVertexIndices->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            puVar10 = (triangulatedFaceVertexIndices->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          }
          else {
            *iVar17._M_current = puVar11[uVar16];
            iVar17._M_current = iVar17._M_current + 1;
            (triangulatedFaceVertexIndices->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar17._M_current;
          }
          if (iVar17._M_current == puVar10) {
            ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                       triangulatedFaceVertexIndices,iVar17,puVar11 + uVar16 + 1);
            puVar11 = (faceVertexIndices->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            iVar17._M_current =
                 (triangulatedFaceVertexIndices->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            puVar10 = (triangulatedFaceVertexIndices->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          }
          else {
            *iVar17._M_current = puVar11[uVar16 + 1];
            iVar17._M_current = iVar17._M_current + 1;
            (triangulatedFaceVertexIndices->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar17._M_current;
          }
          if (iVar17._M_current == puVar10) {
            ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                       triangulatedFaceVertexIndices,iVar17,puVar11 + uVar16 + 2);
          }
          else {
            *iVar17._M_current = puVar11[uVar16 + 2];
            (triangulatedFaceVertexIndices->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar17._M_current + 1;
          }
          iVar18._M_current =
               (triangulatedToOrigFaceVertexIndexMap->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          puVar12 = (triangulatedToOrigFaceVertexIndexMap->
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
          if (iVar18._M_current == puVar12) {
            local_148 = auVar9;
            fStack_144 = fVar25;
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      (triangulatedToOrigFaceVertexIndexMap,iVar18,(unsigned_long *)local_148);
            iVar18._M_current =
                 (triangulatedToOrigFaceVertexIndexMap->
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            puVar12 = (triangulatedToOrigFaceVertexIndexMap->
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          }
          else {
            *iVar18._M_current = uVar16;
            iVar18._M_current = iVar18._M_current + 1;
            (triangulatedToOrigFaceVertexIndexMap->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar18._M_current;
          }
          _local_148 = (pointer)(uVar16 + 1);
          if (iVar18._M_current == puVar12) {
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      (triangulatedToOrigFaceVertexIndexMap,iVar18,(unsigned_long *)local_148);
            iVar18._M_current =
                 (triangulatedToOrigFaceVertexIndexMap->
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            puVar12 = (triangulatedToOrigFaceVertexIndexMap->
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          }
          else {
            *iVar18._M_current = (unsigned_long)_local_148;
            iVar18._M_current = iVar18._M_current + 1;
            (triangulatedToOrigFaceVertexIndexMap->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar18._M_current;
          }
          pcVar1 = (pointer)(uVar16 + 2);
          fStack_144 = (float)((ulong)pcVar1 >> 0x20);
          if (iVar18._M_current == puVar12) {
            _local_148 = pcVar1;
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      (triangulatedToOrigFaceVertexIndexMap,iVar18,(unsigned_long *)local_148);
          }
          else {
            *iVar18._M_current = (unsigned_long)pcVar1;
            (triangulatedToOrigFaceVertexIndexMap->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar18._M_current + 1;
          }
          local_148 = (undefined1  [4])0x1;
          iVar17._M_current =
               (triangulatedFaceCounts->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar17._M_current !=
              (triangulatedFaceCounts->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *iVar17._M_current = 1;
            goto LAB_0033f748;
          }
          goto LAB_0033f755;
        }
        local_b8._M_elems[0] = 0.0;
        local_b8._M_elems[1] = 0.0;
        local_b8._M_elems[2] = 0.0;
        paVar4 = (local_a0->
                 super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar14 = ((long)(local_a0->
                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)paVar4 >> 2) *
                 -0x5555555555555555;
        uVar19 = 1;
        do {
          uVar20 = (ulong)puVar11[uVar16 + (uVar19 - 1)];
          uVar21 = 0;
          if (uVar19 != uVar13) {
            uVar21 = uVar19;
          }
          local_148 = auVar8;
          if ((uVar14 < uVar20 || uVar14 - uVar20 == 0) ||
             (uVar21 = (ulong)puVar11[uVar16 + uVar21], uVar14 < uVar21 || uVar14 - uVar21 == 0)) {
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_118,"Invalid vertex index.\n","");
            fmt::format((string *)local_148,&local_118);
            goto LAB_0033fa51;
          }
          fVar28 = (float)*(undefined8 *)(paVar4[uVar21]._M_elems + 1);
          fVar29 = (float)((ulong)*(undefined8 *)(paVar4[uVar21]._M_elems + 1) >> 0x20);
          fVar22 = (float)*(undefined8 *)(paVar4[uVar20]._M_elems + 1);
          fVar25 = (float)((ulong)*(undefined8 *)(paVar4[uVar20]._M_elems + 1) >> 0x20);
          local_b8._M_elems[0] =
               local_b8._M_elems[0] + (double)((fVar29 + fVar25) * (fVar22 - fVar28));
          local_b8._M_elems[1] =
               local_b8._M_elems[1] +
               (double)((paVar4[uVar21]._M_elems[0] + paVar4[uVar20]._M_elems[0]) *
                       (fVar25 - fVar29));
          local_b8._M_elems[2] =
               local_b8._M_elems[2] +
               (double)((fVar22 + fVar28) *
                       (paVar4[uVar20]._M_elems[0] - paVar4[uVar21]._M_elems[0]));
          args_1 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)((uVar19 - uVar13) + 1);
          uVar19 = uVar19 + 1;
        } while (args_1 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1);
        local_80 = triangulatedToOrigFaceVertexIndexMap;
        dVar23 = vlength(&local_b8);
        if (ABS(dVar23) < 2.220446049250313e-16) {
          ::std::__cxx11::string::_M_replace((ulong)err,0,(char *)err->_M_string_length,0x5e5712);
          return false;
        }
        local_f8._8_8_ = faceVertexCounts;
        local_f8._16_8_ = triangulatedFaceVertexCounts;
        vnormalize(&local_b8,2.220446049250313e-16);
        local_b8._M_elems[2] = (double)local_138._M_allocated_capacity;
        local_b8._M_elems[0] = (double)CONCAT44(fStack_144,local_148);
        local_b8._M_elems[1] = (double)uStack_140;
        local_68._M_elems[0] = (float)local_b8._M_elems[0];
        local_68._M_elems[1] = (float)(double)uStack_140;
        local_68._M_elems[2] = (float)(double)local_138._M_allocated_capacity;
        auVar24._0_8_ =
             CONCAT44((int)((uint)(0.9999999 < ABS(local_68._M_elems[0])) << 0x1f) >> 0x1f,
                      (int)((uint)(0.9999999 < ABS(local_68._M_elems[0])) << 0x1f) >> 0x1f);
        auVar24._8_8_ = 0;
        auVar26 = ~auVar24 & ZEXT416(0x3f800000);
        local_78._M_elems._0_8_ = auVar24._0_8_ & DAT_005e16e0 | auVar26._0_8_;
        local_78._M_elems[2] = 0.0;
        fVar30 = vcross(&local_68,&local_78);
        auVar27 = auVar26._4_12_;
        local_148 = fVar30._M_elems[0];
        fStack_144 = fVar30._M_elems[1];
        uStack_140._0_4_ = fVar30._M_elems[2];
        local_e0 = vnormalize((float3 *)local_148,1.1920929e-07);
        fVar30 = vcross(&local_68,&local_e0);
        triangulatedToOrigFaceVertexIndexMap = local_80;
        auVar26._0_4_ = fVar30._M_elems[2];
        auVar26._4_12_ = auVar27;
        fVar22 = fVar30._M_elems[0];
        fVar25 = fVar30._M_elems[1];
        local_148 = (undefined1  [4])0x0;
        fStack_144 = 0.0;
        uStack_140 = (array<float,_2UL> *)0x0;
        local_138._M_allocated_capacity = 0;
        uVar14 = 0;
        local_98._8_4_ = (int)extraout_XMM0_Qb;
        local_98._0_8_ = fVar30._M_elems._0_8_;
        local_98._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
        local_58 = fVar25;
        fStack_54 = fVar25;
        fStack_50 = fVar25;
        fStack_4c = fVar25;
        local_48 = auVar26;
        do {
          uVar2 = (faceVertexIndices->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar16 + uVar14];
          paVar4 = (local_a0->
                   super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_118._M_dataplus._M_p =
               (pointer)CONCAT44(local_e0._M_elems[2] * paVar4[uVar2]._M_elems[2] +
                                 local_e0._M_elems[0] * paVar4[uVar2]._M_elems[0] +
                                 paVar4[uVar2]._M_elems[1] * local_e0._M_elems[1],
                                 auVar26._0_4_ * paVar4[uVar2]._M_elems[2] +
                                 fVar22 * paVar4[uVar2]._M_elems[0] +
                                 paVar4[uVar2]._M_elems[1] * fVar25);
          if (uStack_140 == (array<float,_2UL> *)local_138._M_allocated_capacity) {
            ::std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>::
            _M_realloc_insert<std::array<float,2ul>>
                      ((vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>> *)
                       local_148,uStack_140,(array<float,_2UL> *)&local_118);
            auVar26 = local_48;
            fVar22 = (float)local_98._0_4_;
            fVar25 = local_58;
          }
          else {
            *(pointer *)uStack_140->_M_elems = local_118._M_dataplus._M_p;
            uStack_140 = uStack_140 + 1;
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < uVar13);
        local_118._M_dataplus._M_p = (pointer)0x0;
        local_118._M_string_length = 0;
        local_118.field_2._M_allocated_capacity = 0;
        mapbox::
        earcut<unsigned_int,std::vector<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>,std::allocator<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>>>
                  (&local_d0,(mapbox *)&local_118,
                   (vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
                    *)faceVertexIndices);
        triangulatedFaceVertexCounts =
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8._16_8_;
        uVar13 = (long)local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar13;
        if (SUB168(auVar5 * ZEXT816(0xaaaaaaaaaaaaaaab),0) < 0x5555555555555556) {
          if (uVar13 >> 0x1f < 3) {
            uVar14 = uVar13 / 3;
            local_98._0_8_ = uVar14;
            if (2 < uVar13) {
              lVar15 = 0;
              do {
                local_128 = CONCAT44(local_128._4_4_,3);
                iVar17._M_current =
                     (triangulatedFaceVertexCounts->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar17._M_current ==
                    (triangulatedFaceVertexCounts->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  _M_realloc_insert<unsigned_int>
                            (triangulatedFaceVertexCounts,iVar17,(uint *)&local_128);
                }
                else {
                  *iVar17._M_current = 3;
                  (triangulatedFaceVertexCounts->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar17._M_current + 1;
                }
                puVar11 = (faceVertexIndices->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                iVar17._M_current =
                     (triangulatedFaceVertexIndices->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                puVar10 = (triangulatedFaceVertexIndices->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
                if (iVar17._M_current == puVar10) {
                  ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                             triangulatedFaceVertexIndices,iVar17,
                             puVar11 + uVar16 + *(uint *)((long)local_d0.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar15
                                                  ));
                  puVar11 = (faceVertexIndices->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start;
                  iVar17._M_current =
                       (triangulatedFaceVertexIndices->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
                  puVar10 = (triangulatedFaceVertexIndices->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_end_of_storage;
                }
                else {
                  *iVar17._M_current =
                       puVar11[uVar16 + *(uint *)((long)local_d0.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar15
                                                 )];
                  iVar17._M_current = iVar17._M_current + 1;
                  (triangulatedFaceVertexIndices->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar17._M_current;
                }
                triangulatedFaceVertexCounts =
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8._16_8_;
                args_1 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(puVar11 + uVar16);
                __args = (uint *)((long)&(args_1->
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         )._M_impl.super__Vector_impl_data._M_start +
                                 (ulong)*(uint *)((long)local_d0.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                 lVar15 + 4) * 4);
                if (iVar17._M_current == puVar10) {
                  ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                             triangulatedFaceVertexIndices,iVar17,__args);
                  puVar11 = (faceVertexIndices->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start;
                  iVar17._M_current =
                       (triangulatedFaceVertexIndices->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
                  puVar10 = (triangulatedFaceVertexIndices->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_end_of_storage;
                }
                else {
                  *iVar17._M_current = *__args;
                  iVar17._M_current = iVar17._M_current + 1;
                  (triangulatedFaceVertexIndices->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar17._M_current;
                }
                if (iVar17._M_current == puVar10) {
                  ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                             triangulatedFaceVertexIndices,iVar17,
                             puVar11 + uVar16 + *(uint *)((long)local_d0.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  lVar15 + 8));
                }
                else {
                  *iVar17._M_current =
                       puVar11[uVar16 + *(uint *)((long)local_d0.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                 lVar15 + 8)];
                  (triangulatedFaceVertexIndices->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar17._M_current + 1;
                }
                local_128 = *(uint *)((long)local_d0.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar15) +
                            uVar16;
                iVar18._M_current =
                     (triangulatedToOrigFaceVertexIndexMap->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                puVar12 = (triangulatedToOrigFaceVertexIndexMap->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_end_of_storage;
                if (iVar18._M_current == puVar12) {
                  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                  _M_realloc_insert<unsigned_long>
                            (triangulatedToOrigFaceVertexIndexMap,iVar18,&local_128);
                  iVar18._M_current =
                       (triangulatedToOrigFaceVertexIndexMap->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
                  puVar12 = (triangulatedToOrigFaceVertexIndexMap->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
                }
                else {
                  *iVar18._M_current = local_128;
                  iVar18._M_current = iVar18._M_current + 1;
                  (triangulatedToOrigFaceVertexIndexMap->
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar18._M_current;
                }
                local_128 = *(uint *)((long)local_d0.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar15 + 4)
                            + uVar16;
                if (iVar18._M_current == puVar12) {
                  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                  _M_realloc_insert<unsigned_long>
                            (triangulatedToOrigFaceVertexIndexMap,iVar18,&local_128);
                  iVar18._M_current =
                       (triangulatedToOrigFaceVertexIndexMap->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
                  puVar12 = (triangulatedToOrigFaceVertexIndexMap->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
                }
                else {
                  *iVar18._M_current = local_128;
                  iVar18._M_current = iVar18._M_current + 1;
                  (triangulatedToOrigFaceVertexIndexMap->
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar18._M_current;
                }
                local_128 = *(uint *)((long)local_d0.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar15 + 8)
                            + uVar16;
                if (iVar18._M_current == puVar12) {
                  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                  _M_realloc_insert<unsigned_long>
                            (triangulatedToOrigFaceVertexIndexMap,iVar18,&local_128);
                }
                else {
                  *iVar18._M_current = local_128;
                  (triangulatedToOrigFaceVertexIndexMap->
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar18._M_current + 1;
                }
                lVar15 = lVar15 + 0xc;
                uVar14 = uVar14 - 1;
              } while (uVar14 != 0);
            }
            local_128 = CONCAT44(local_128._4_4_,local_98._0_4_);
            iVar17._M_current =
                 (triangulatedFaceCounts->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar17._M_current ==
                (triangulatedFaceCounts->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(triangulatedFaceCounts,iVar17,(uint *)&local_128);
            }
            else {
              *iVar17._M_current = local_98._0_4_;
              (triangulatedFaceCounts->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar17._M_current + 1;
            }
            bVar7 = true;
          }
          else {
            bVar7 = false;
            args_1 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x22;
            ::std::__cxx11::string::_M_replace((ulong)err,0,(char *)err->_M_string_length,0x5e5746);
          }
        }
        else {
          bVar7 = false;
          args_1 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x17;
          ::std::__cxx11::string::_M_replace((ulong)err,0,(char *)err->_M_string_length,0x5e572e);
          triangulatedFaceVertexCounts =
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8._16_8_;
        }
        faceVertexCounts = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8._8_8_;
        if (local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_d0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        ::std::
        vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
        ::~vector((vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
                   *)&local_118);
        pvVar6 = (void *)CONCAT44(fStack_144,local_148);
        if (pvVar6 != (void *)0x0) {
          operator_delete(pvVar6,local_138._M_allocated_capacity - (long)pvVar6);
        }
        if (!bVar7) {
          return false;
        }
      }
      uVar16 = uVar16 + local_11c;
      local_f8._0_8_ = local_f8._0_8_ + 1;
      puVar11 = (faceVertexCounts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while ((ulong)local_f8._0_8_ <
             (pointer)((long)(faceVertexCounts->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar11 >> 2));
  }
  return true;
}

Assistant:

bool TriangulatePolygon(
    const std::vector<T> &points, const std::vector<uint32_t> &faceVertexCounts,
    const std::vector<uint32_t> &faceVertexIndices,
    std::vector<uint32_t> &triangulatedFaceVertexCounts,
    std::vector<uint32_t> &triangulatedFaceVertexIndices,
    std::vector<size_t> &triangulatedToOrigFaceVertexIndexMap,
    std::vector<uint32_t> &triangulatedFaceCounts, std::string &err) {
  triangulatedFaceVertexCounts.clear();
  triangulatedFaceVertexIndices.clear();

  triangulatedToOrigFaceVertexIndexMap.clear();

  size_t faceIndexOffset = 0;

  // For each polygon(face)
  for (size_t i = 0; i < faceVertexCounts.size(); i++) {
    uint32_t npolys = faceVertexCounts[i];

    if (npolys < 3) {
      err = fmt::format(
          "faceVertex count must be 3(triangle) or "
          "more(polygon), but got faceVertexCounts[{}] = {}\n",
          i, npolys);
      return false;
    }

    if (faceIndexOffset + npolys > faceVertexIndices.size()) {
      err = fmt::format(
          "Invalid faceVertexIndices or faceVertexCounts. faceVertex index "
          "exceeds faceVertexIndices.size() at [{}]\n",
          i);
      return false;
    }

    if (npolys == 3) {
      // No need for triangulation.
      triangulatedFaceVertexCounts.push_back(3);
      triangulatedFaceVertexIndices.push_back(
          faceVertexIndices[faceIndexOffset + 0]);
      triangulatedFaceVertexIndices.push_back(
          faceVertexIndices[faceIndexOffset + 1]);
      triangulatedFaceVertexIndices.push_back(
          faceVertexIndices[faceIndexOffset + 2]);
      triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset + 0);
      triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset + 1);
      triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset + 2);
      triangulatedFaceCounts.push_back(1);
#if 1
    } else if (npolys == 4) {
      // Use simple split
      // TODO: Split at shortest edge for better triangulation.
      triangulatedFaceVertexCounts.push_back(3);
      triangulatedFaceVertexCounts.push_back(3);

      triangulatedFaceVertexIndices.push_back(
          faceVertexIndices[faceIndexOffset + 0]);
      triangulatedFaceVertexIndices.push_back(
          faceVertexIndices[faceIndexOffset + 1]);
      triangulatedFaceVertexIndices.push_back(
          faceVertexIndices[faceIndexOffset + 2]);

      triangulatedFaceVertexIndices.push_back(
          faceVertexIndices[faceIndexOffset + 0]);
      triangulatedFaceVertexIndices.push_back(
          faceVertexIndices[faceIndexOffset + 2]);
      triangulatedFaceVertexIndices.push_back(
          faceVertexIndices[faceIndexOffset + 3]);

      triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset + 0);
      triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset + 1);
      triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset + 2);
      triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset + 0);
      triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset + 2);
      triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset + 3);
      triangulatedFaceCounts.push_back(2);
#endif
    } else {
      // Use double for accuracy. `float` precision may classify small-are polygon as degenerated.
      // Find the normal axis of the polygon using Newell's method
      value::double3 n = {0, 0, 0};

      size_t vi0;
      size_t vi0_2;

      for (size_t k = 0; k < npolys; ++k) {
        vi0 = faceVertexIndices[faceIndexOffset + k];

        size_t j = (k + 1) % npolys;
        vi0_2 = faceVertexIndices[faceIndexOffset + j];

        if (vi0 >= points.size()) {
          err = fmt::format("Invalid vertex index.\n");
          return false;
        }

        if (vi0_2 >= points.size()) {
          err = fmt::format("Invalid vertex index.\n");
          return false;
        }

        T v0 = points[vi0];
        T v1 = points[vi0_2];

        const T point1 = {v0[0], v0[1], v0[2]};
        const T point2 = {v1[0], v1[1], v1[2]};

        T a = {point1[0] - point2[0], point1[1] - point2[1],
               point1[2] - point2[2]};
        T b = {point1[0] + point2[0], point1[1] + point2[1],
               point1[2] + point2[2]};

        n[0] += double(a[1] * b[2]);
        n[1] += double(a[2] * b[0]);
        n[2] += double(a[0] * b[1]);
        DCOUT("v0 " << v0);
        DCOUT("v1 " << v1);
        DCOUT("n " << n);
      }
      //BaseTy length_n = vlength(n);
      double length_n = vlength(n);

      // Check if zero length normal
      if (std::fabs(length_n) < std::numeric_limits<double>::epsilon()) {
        DCOUT("length_n " << length_n);
        err = "Degenerated polygon found.\n";
        return false;
      }

      // Negative is to flip the normal to the correct direction
      n = vnormalize(n);

      T axis_w, axis_v, axis_u;
      axis_w[0] = BaseTy(n[0]);
      axis_w[1] = BaseTy(n[1]);
      axis_w[2] = BaseTy(n[2]);
      T a;
      if (std::fabs(axis_w[0]) > BaseTy(0.9999999)) {  // TODO: use 1.0 - eps?
        a = {BaseTy(0), BaseTy(1), BaseTy(0)};
      } else {
        a = {BaseTy(1), BaseTy(0), BaseTy(0)};
      }
      axis_v = vnormalize(vcross(axis_w, a));
      axis_u = vcross(axis_w, axis_v);

      using Point3D = std::array<BaseTy, 3>;
      using Point2D = std::array<BaseTy, 2>;
      std::vector<Point2D> polyline;

      // TMW change: Find best normal and project v0x and v0y to those
      // coordinates, instead of picking a plane aligned with an axis (which
      // can flip polygons).

      // Fill polygon data.
      for (size_t k = 0; k < npolys; k++) {
        size_t vidx = faceVertexIndices[faceIndexOffset + k];

        value::float3 v = points[vidx];
        // Point3 polypoint = {v0[0],v0[1],v0[2]};

        // world to local
        Point3D loc = {vdot(v, axis_u), vdot(v, axis_v), vdot(v, axis_w)};

        polyline.push_back({loc[0], loc[1]});
      }

      std::vector<std::vector<Point2D>> polygon_2d;
      // Single polygon only(no holes)

      std::vector<uint32_t> indices = mapbox::earcut<uint32_t>(polygon_2d);
      //  => result = 3 * faces, clockwise

      if ((indices.size() % 3) != 0) {
        // This should not be happen, though.
        err = "Failed to triangulate.\n";
        return false;
      }

      size_t ntris = indices.size() / 3;

      // Up to 2GB tris.
      if (ntris > size_t((std::numeric_limits<int32_t>::max)())) {
        err = "Too many triangles are generated.\n";
        return false;
      }

      for (size_t k = 0; k < ntris; k++) {
        triangulatedFaceVertexCounts.push_back(3);
        triangulatedFaceVertexIndices.push_back(
            faceVertexIndices[faceIndexOffset + indices[3 * k + 0]]);
        triangulatedFaceVertexIndices.push_back(
            faceVertexIndices[faceIndexOffset + indices[3 * k + 1]]);
        triangulatedFaceVertexIndices.push_back(
            faceVertexIndices[faceIndexOffset + indices[3 * k + 2]]);

        triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset +
                                                       indices[3 * k + 0]);
        triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset +
                                                       indices[3 * k + 1]);
        triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset +
                                                       indices[3 * k + 2]);
      }
      triangulatedFaceCounts.push_back(uint32_t(ntris));
    }

    faceIndexOffset += npolys;
  }

  return true;
}